

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

bool __thiscall
tcu::x11::XlibDisplay::getVisualInfo(XlibDisplay *this,VisualID visualID,XVisualInfo *dst)

{
  void *__src;
  bool local_71;
  bool succ;
  XVisualInfo *response;
  undefined1 local_60 [4];
  int numVisuals;
  XVisualInfo query;
  XVisualInfo *dst_local;
  VisualID visualID_local;
  XlibDisplay *this_local;
  
  response._4_4_ = 0;
  query.visual = (Visual *)visualID;
  query._56_8_ = dst;
  __src = (void *)XGetVisualInfo(this->m_display,1,local_60,(long)&response + 4);
  local_71 = false;
  if (__src != (void *)0x0) {
    local_71 = 0 < response._4_4_;
    if (local_71) {
      memcpy((void *)query._56_8_,__src,0x40);
    }
    XFree(__src);
  }
  return local_71;
}

Assistant:

bool XlibDisplay::getVisualInfo (VisualID visualID, XVisualInfo& dst)
{
	XVisualInfo		query;
	query.visualid = visualID;
	int				numVisuals	= 0;
	XVisualInfo*	response	= XGetVisualInfo(m_display, VisualIDMask, &query, &numVisuals);
	bool			succ		= false;

	if (response != DE_NULL)
	{
		if (numVisuals > 0) // should be 1, but you never know...
		{
			dst = response[0];
			succ = true;
		}
		XFree(response);
	}

	return succ;
}